

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O1

void __thiscall
cmCursesLongMessageForm::Render
          (cmCursesLongMessageForm *this,int param_1,int param_2,int param_3,int param_4)

{
  FIELD *field;
  FORM *pFVar1;
  int iVar2;
  int cols;
  
  if (_stdscr == 0) {
    iVar2 = -7;
    cols = -3;
  }
  else {
    iVar2 = *(short *)(_stdscr + 4) + -5;
    cols = *(short *)(_stdscr + 6) + -1;
  }
  pFVar1 = (this->super_cmCursesForm).Form;
  if (pFVar1 != (FORM *)0x0) {
    unpost_form(pFVar1);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields[0] != (FIELD *)0x0) {
    free_field(this->Fields[0]);
    this->Fields[0] = (FIELD *)0x0;
  }
  field = new_field(iVar2,cols,1,1,0,0);
  this->Fields[0] = field;
  field_opts_off(field,0x200);
  pFVar1 = new_form(this->Fields);
  (this->super_cmCursesForm).Form = pFVar1;
  post_form(pFVar1);
  form_driver((this->super_cmCursesForm).Form,0x216);
  DrawMessage(this,(this->Messages)._M_dataplus._M_p);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
  if (_stdscr == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar2,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::Render(int /*left*/, int /*top*/, int /*width*/,
                                     int /*height*/)
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);

  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }

  if (this->Fields[0]) {
    free_field(this->Fields[0]);
    this->Fields[0] = nullptr;
  }

  this->Fields[0] = new_field(y - 6, x - 2, 1, 1, 0, 0);

  field_opts_off(this->Fields[0], O_STATIC);

  this->Form = new_form(this->Fields);
  post_form(this->Form);

  form_driver(this->Form, REQ_BEG_FIELD);
  this->DrawMessage(this->Messages.c_str());

  this->UpdateStatusBar();
  touchwin(stdscr);
  refresh();
}